

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O3

filename_t * __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::filename_abi_cxx11_
          (filename_t *__return_storage_ptr__,rotating_file_sink<std::mutex> *this)

{
  mutex *__mutex;
  pointer pcVar1;
  int iVar2;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->file_helper_).filename_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->file_helper_).filename_._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::filename() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    return file_helper_.filename();
}